

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.c
# Opt level: O3

void tar_mode_r(bsdtar *bsdtar)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  bsdtar *bsdtar_00;
  int64_t __offset;
  char *pcVar4;
  char *pcVar5;
  __off_t _Var6;
  int *piVar7;
  char *fmt;
  archive *paVar8;
  archive_entry *entry;
  archive_entry *local_30;
  
  test_for_append(bsdtar);
  paVar8 = (archive *)0x42;
  iVar1 = open(bsdtar->filename,0x42,0x1b6);
  bsdtar->fd = iVar1;
  if (iVar1 < 0) {
    piVar7 = __errno_location();
    iVar1 = *piVar7;
    pcVar4 = bsdtar->filename;
    pcVar5 = "Cannot open %s";
  }
  else {
    bsdtar_00 = (bsdtar *)archive_read_new();
    archive_read_support_filter_all((archive *)bsdtar_00);
    archive_read_support_format_empty((archive *)bsdtar_00);
    archive_read_support_format_tar((archive *)bsdtar_00);
    archive_read_support_format_gnutar((archive *)bsdtar_00);
    set_reader_options(bsdtar_00,paVar8);
    iVar1 = archive_read_open_fd((archive *)bsdtar_00,bsdtar->fd,0x2800);
    if (iVar1 != 0) {
      iVar1 = archive_errno((archive *)bsdtar_00);
      pcVar5 = bsdtar->filename;
      pcVar4 = archive_error_string((archive *)bsdtar_00);
      fmt = "Can\'t read archive %s: %s";
LAB_00112d69:
      lafe_errc(1,iVar1,fmt,pcVar5,pcVar4);
    }
    iVar1 = archive_read_next_header((archive *)bsdtar_00,&local_30);
    uVar2 = 0x30003;
    if (iVar1 == 0) {
      do {
        iVar1 = archive_filter_code((archive *)bsdtar_00,0);
        if (iVar1 != 0) {
          archive_read_free((archive *)bsdtar_00);
          close(bsdtar->fd);
          pcVar4 = "Cannot append to compressed archive.";
          iVar1 = 0;
          goto LAB_00112d21;
        }
        uVar2 = archive_format((archive *)bsdtar_00);
        iVar1 = archive_read_next_header((archive *)bsdtar_00,&local_30);
      } while (iVar1 == 0);
    }
    __offset = archive_read_header_position((archive *)bsdtar_00);
    archive_read_free((archive *)bsdtar_00);
    paVar8 = archive_write_new();
    pcVar4 = cset_get_format(bsdtar->cset);
    if (pcVar4 == (char *)0x0) {
      uVar3 = 0x30003;
      if (uVar2 != 0x60000) {
        uVar3 = uVar2;
      }
      archive_write_set_format(paVar8,uVar3);
    }
    else {
      pcVar4 = cset_get_format(bsdtar->cset);
      archive_write_set_format_by_name(paVar8,pcVar4);
      uVar3 = archive_format(paVar8);
      if (((uVar2 & 0xff0000) != 0x60000) && ((uVar2 & 0xff0000) != (uVar3 & 0xff0000))) {
        pcVar5 = cset_get_format(bsdtar->cset);
        pcVar4 = bsdtar->filename;
        fmt = "Format %s is incompatible with the archive %s.";
        iVar1 = 0;
        goto LAB_00112d69;
      }
    }
    _Var6 = lseek(bsdtar->fd,__offset,0);
    if (_Var6 < 0) {
      piVar7 = __errno_location();
      iVar1 = *piVar7;
      pcVar4 = "Could not seek to archive end";
LAB_00112d21:
      lafe_errc(1,iVar1,pcVar4);
    }
    set_writer_options(bsdtar,paVar8);
    iVar1 = archive_write_open_fd(paVar8,bsdtar->fd);
    if (iVar1 == 0) {
      write_archive(paVar8,bsdtar);
      close(bsdtar->fd);
      bsdtar->fd = -1;
      return;
    }
    pcVar4 = archive_error_string(paVar8);
    pcVar5 = "%s";
    iVar1 = 0;
  }
  lafe_errc(1,iVar1,pcVar5,pcVar4);
}

Assistant:

void
tar_mode_r(struct bsdtar *bsdtar)
{
	int64_t	end_offset;
	int	format;
	struct archive *a;
	struct archive_entry *entry;
	int	r;

	/* Sanity-test some arguments and the file. */
	test_for_append(bsdtar);

	format = ARCHIVE_FORMAT_TAR_PAX_RESTRICTED;

#if defined(__BORLANDC__)
	bsdtar->fd = open(bsdtar->filename, O_RDWR | O_CREAT | O_BINARY);
#else
	bsdtar->fd = open(bsdtar->filename, O_RDWR | O_CREAT | O_BINARY, 0666);
#endif
	if (bsdtar->fd < 0)
		lafe_errc(1, errno,
		    "Cannot open %s", bsdtar->filename);

	a = archive_read_new();
	archive_read_support_filter_all(a);
	archive_read_support_format_empty(a);
	archive_read_support_format_tar(a);
	archive_read_support_format_gnutar(a);
	set_reader_options(bsdtar, a);
	r = archive_read_open_fd(a, bsdtar->fd, 10240);
	if (r != ARCHIVE_OK)
		lafe_errc(1, archive_errno(a),
		    "Can't read archive %s: %s", bsdtar->filename,
		    archive_error_string(a));
	while (0 == archive_read_next_header(a, &entry)) {
		if (archive_filter_code(a, 0) != ARCHIVE_FILTER_NONE) {
			archive_read_free(a);
			close(bsdtar->fd);
			lafe_errc(1, 0,
			    "Cannot append to compressed archive.");
		}
		/* Keep going until we hit end-of-archive */
		format = archive_format(a);
	}

	end_offset = archive_read_header_position(a);
	archive_read_free(a);

	/* Re-open archive for writing */
	a = archive_write_new();
	/*
	 * Set the format to be used for writing.  To allow people to
	 * extend empty files, we need to allow them to specify the format,
	 * which opens the possibility that they will specify a format that
	 * doesn't match the existing format.  Hence, the following bit
	 * of arcane ugliness.
	 */

	if (cset_get_format(bsdtar->cset) != NULL) {
		/* If the user requested a format, use that, but ... */
		archive_write_set_format_by_name(a,
		    cset_get_format(bsdtar->cset));
		/* ... complain if it's not compatible. */
		format &= ARCHIVE_FORMAT_BASE_MASK;
		if (format != (int)(archive_format(a) & ARCHIVE_FORMAT_BASE_MASK)
		    && format != ARCHIVE_FORMAT_EMPTY) {
			lafe_errc(1, 0,
			    "Format %s is incompatible with the archive %s.",
			    cset_get_format(bsdtar->cset), bsdtar->filename);
		}
	} else {
		/*
		 * Just preserve the current format, with a little care
		 * for formats that libarchive can't write.
		 */
		if (format == ARCHIVE_FORMAT_EMPTY)
			format = ARCHIVE_FORMAT_TAR_PAX_RESTRICTED;
		archive_write_set_format(a, format);
	}
	if (lseek(bsdtar->fd, end_offset, SEEK_SET) < 0)
		lafe_errc(1, errno, "Could not seek to archive end");
	set_writer_options(bsdtar, a);
	if (ARCHIVE_OK != archive_write_open_fd(a, bsdtar->fd))
		lafe_errc(1, 0, "%s", archive_error_string(a));

	write_archive(a, bsdtar); /* XXX check return val XXX */

	close(bsdtar->fd);
	bsdtar->fd = -1;
}